

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLEVER.cpp
# Opt level: O2

void __thiscall
CLEVER::addAlignment
          (CLEVER *this,
          unique_ptr<AlignmentRecord,_std::default_delete<AlignmentRecord>_> *alignment_autoptr,
          int *edgecounter,int *nonEdgeCounter,int numGCAllowedPos,int ct)

{
  AlignmentRecord *this_00;
  EdgeCalculator *pEVar1;
  AlignmentRecord *this_01;
  LogWriter *this_02;
  Clique *this_03;
  bool bVar2;
  int iVar3;
  alignment_id_t aVar4;
  alignment_id_t v2;
  uint uVar5;
  _Base_ptr p_Var6;
  _List_node_base *p_Var7;
  iterator __position;
  size_type sVar8;
  Clique *pCVar9;
  pointer ppCVar10;
  pointer ppCVar11;
  size_t i;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  size_t i_1;
  vector<Clique_*,_std::allocator<Clique_*>_> new_cliques;
  _Head_base<0UL,_Clique_*,_false> local_a0;
  Clique *clique;
  uint local_90;
  uint local_8c;
  pointer local_88;
  unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  intersection;
  ulong local_78;
  Clique *split_off_clique;
  alignment_set_t adjacent;
  
  aVar4 = (this->super_CliqueFinder).next_id;
  (this->super_CliqueFinder).next_id = aVar4 + 1;
  this_00 = (alignment_autoptr->_M_t).
            super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
            super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
            super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl;
  (alignment_autoptr->_M_t).
  super___uniq_ptr_impl<AlignmentRecord,_std::default_delete<AlignmentRecord>_>._M_t.
  super__Tuple_impl<0UL,_AlignmentRecord_*,_std::default_delete<AlignmentRecord>_>.
  super__Head_base<0UL,_AlignmentRecord_*,_false>._M_head_impl = (AlignmentRecord *)0x0;
  local_90 = numGCAllowedPos;
  local_8c = ct;
  AlignmentRecord::setID(this_00,aVar4);
  local_88 = (pointer)(this->super_CliqueFinder).alignment_count;
  ppCVar10 = (pointer)this->capacity;
  if (local_88 == ppCVar10) {
    reorganize_storage(this);
    local_88 = (pointer)(this->super_CliqueFinder).alignment_count;
    ppCVar10 = (pointer)this->capacity;
  }
  (this->super_CliqueFinder).alignment_count = (long)local_88 + 1;
  this->alignments[(long)local_88] = this_00;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&adjacent,(size_type)ppCVar10,0,(allocator<unsigned_long> *)&new_cliques);
  p_Var6 = (this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_78 = 1;
  for (; (_Rb_tree_header *)p_Var6 !=
         &(this->alignments_by_length)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
    pEVar1 = (this->super_CliqueFinder).edge_calculator;
    this_01 = this->alignments[(long)p_Var6[1]._M_parent];
    iVar3 = (*pEVar1->_vptr_EdgeCalculator[2])
                      (pEVar1,this_00,this_01,(ulong)local_90,(ulong)local_8c);
    if (((char)iVar3 == '\0') ||
       ((pEVar1 = (this->super_CliqueFinder).second_edge_calculator, pEVar1 != (EdgeCalculator *)0x0
        && (iVar3 = (*pEVar1->_vptr_EdgeCalculator[2])
                              (pEVar1,this_00,this_01,(ulong)local_90,(ulong)local_8c),
           (char)iVar3 == '\0')))) {
      *nonEdgeCounter = *nonEdgeCounter + 1;
    }
    else {
      *edgecounter = *edgecounter + 1;
      adjacent.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[(ulong)p_Var6[1]._M_parent >> 6] =
           adjacent.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start[(ulong)p_Var6[1]._M_parent >> 6] |
           1L << ((byte)p_Var6[1]._M_parent & 0x3f);
      this_02 = this->lw;
      if (this_02 != (LogWriter *)0x0) {
        aVar4 = AlignmentRecord::getID(this_00);
        v2 = AlignmentRecord::getID(this_01);
        LogWriter::reportEdge(this_02,aVar4,v2);
      }
      (this->super_CliqueFinder).converged = false;
    }
  }
  new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
  super__Vector_impl_data._M_finish = local_88;
  std::
  _Rb_tree<std::pair<unsigned_int,unsigned_long>,std::pair<unsigned_int,unsigned_long>,std::_Identity<std::pair<unsigned_int,unsigned_long>>,std::less<std::pair<unsigned_int,unsigned_long>>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
  ::_M_insert_unique<std::pair<unsigned_int,unsigned_long>>
            ((_Rb_tree<std::pair<unsigned_int,unsigned_long>,std::pair<unsigned_int,unsigned_long>,std::_Identity<std::pair<unsigned_int,unsigned_long>>,std::less<std::pair<unsigned_int,unsigned_long>>,std::allocator<std::pair<unsigned_int,unsigned_long>>>
              *)&this->alignments_by_length,(pair<unsigned_int,_unsigned_long> *)&new_cliques);
  p_Var7 = (_List_node_base *)(this->super_CliqueFinder).cliques;
  __position._M_node =
       (((_List_base<Clique_*,_std::allocator<Clique_*>_> *)&p_Var7->_M_next)->_M_impl)._M_node.
       super__List_node_base._M_next;
  new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    if (__position._M_node == p_Var7) {
      if (new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pCVar9 = (Clique *)operator_new(0x30);
        Clique::Clique(pCVar9,&this->super_CliqueFinder,(size_t)local_88,this->capacity);
        clique = pCVar9;
        std::vector<Clique*,std::allocator<Clique*>>::emplace_back<Clique*>
                  ((vector<Clique*,std::allocator<Clique*>> *)&new_cliques,&clique);
      }
      uVar12 = 0;
      do {
        if ((ulong)((long)new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3) <= uVar12) {
          lVar14 = 0;
          ppCVar10 = new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          ppCVar11 = new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          for (uVar12 = 0; uVar12 < (ulong)((long)ppCVar10 - (long)ppCVar11 >> 3);
              uVar12 = uVar12 + 1) {
            if (*(long *)((long)ppCVar11 + lVar14) != 0) {
              std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::push_back
                        ((this->super_CliqueFinder).cliques,(value_type *)((long)ppCVar11 + lVar14))
              ;
              ppCVar10 = new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
              ppCVar11 = new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
            }
            lVar14 = lVar14 + 8;
          }
          std::_Vector_base<Clique_*,_std::allocator<Clique_*>_>::~_Vector_base
                    (&new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&adjacent);
          return;
        }
        pCVar9 = new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar12];
        uVar13 = local_78;
        if (pCVar9 != (Clique *)0x0) {
          for (; uVar13 < (ulong)((long)new_cliques.
                                        super__Vector_base<Clique_*,_std::allocator<Clique_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)new_cliques.
                                        super__Vector_base<Clique_*,_std::allocator<Clique_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start >> 3);
              uVar13 = uVar13 + 1) {
            this_03 = new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar13];
            if (this_03 != (Clique *)0x0) {
              if (this_03->alignment_count < pCVar9->alignment_count) {
                bVar2 = Clique::contains(pCVar9,this_03);
                if (bVar2) {
                  (*this_03->_vptr_Clique[1])(this_03);
                  new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13] = (Clique *)0x0;
                }
              }
              else {
                bVar2 = Clique::contains(this_03,pCVar9);
                if (bVar2) {
                  (*pCVar9->_vptr_Clique[1])(pCVar9);
                  new_cliques.super__Vector_base<Clique_*,_std::allocator<Clique_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar12] = (Clique *)0x0;
                  break;
                }
              }
            }
          }
        }
        uVar12 = uVar12 + 1;
        local_78 = local_78 + 1;
      } while( true );
    }
    clique = (Clique *)__position._M_node[1]._M_next;
    uVar12 = clique->rightmost_segment_end;
    uVar5 = AlignmentRecord::getIntervalStart(this_00);
    if (uVar12 < uVar5) {
      __position = std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::erase
                             ((this->super_CliqueFinder).cliques,__position._M_node);
      local_a0._M_head_impl = clique;
      CliqueCollector::add
                ((this->super_CliqueFinder).clique_collector,
                 (unique_ptr<Clique,_std::default_delete<Clique>_> *)&local_a0,this->appearanceMap);
      if (local_a0._M_head_impl != (Clique *)0x0) {
        (*(local_a0._M_head_impl)->_vptr_Clique[1])();
      }
      local_a0._M_head_impl = (Clique *)0x0;
    }
    else {
      Clique::intersect((Clique *)&intersection,(alignment_set_t *)clique);
      bVar2 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                        ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                         intersection._M_t.
                         super___uniq_ptr_impl<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         .
                         super__Head_base<0UL,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
                         ._M_head_impl);
      if (bVar2) {
        sVar8 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                          ((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                           intersection._M_t.
                           super___uniq_ptr_impl<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           .
                           super__Head_base<0UL,_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_*,_false>
                           ._M_head_impl);
        if (sVar8 != clique->alignment_count) {
          pCVar9 = (Clique *)operator_new(0x30);
          Clique::Clique(pCVar9,&this->super_CliqueFinder,&intersection);
          split_off_clique = pCVar9;
          Clique::add(pCVar9,(size_t)local_88);
          std::vector<Clique_*,_std::allocator<Clique_*>_>::push_back
                    (&new_cliques,&split_off_clique);
          goto LAB_00173761;
        }
        Clique::add(clique,(size_t)local_88);
        std::vector<Clique_*,_std::allocator<Clique_*>_>::push_back(&new_cliques,&clique);
        __position = std::__cxx11::list<Clique_*,_std::allocator<Clique_*>_>::erase
                               ((this->super_CliqueFinder).cliques,__position._M_node);
      }
      else {
LAB_00173761:
        __position._M_node = (__position._M_node)->_M_next;
      }
      std::
      unique_ptr<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~unique_ptr(&intersection);
    }
    p_Var7 = (_List_node_base *)(this->super_CliqueFinder).cliques;
  } while( true );
}

Assistant:

void CLEVER::addAlignment(std::unique_ptr<AlignmentRecord>& alignment_autoptr, int& edgecounter, int& nonEdgeCounter, int numGCAllowedPos, int ct) {
    assert(alignment_autoptr.get() != 0);
	assert(cliques!=0);
    assert(initialized);

	alignment_id_t id = next_id++;
	AlignmentRecord* alignment = alignment_autoptr.release();
	alignment->setID(id);

	// store new alignment
	if (alignment_count==capacity) {
		reorganize_storage();
	}
	size_t index = alignment_count++;
	alignments[index] = alignment;

	// TODO: Once edge criteria are fixed, we can try to (re-)gain some efficiency here...
// 	if (single_end) {
		
// 	} else {
// 		alignments_by_length.insert(make_pair(alignment->getInsertLength(), index));
// 	}
	// determine all edges from current alignment pair
	alignment_set_t adjacent(capacity);
	// determine range of insert lengths to be searched
	typedef set<length_and_index_t>::const_iterator iterator_t;
	iterator_t it = alignments_by_length.begin();
	iterator_t end = alignments_by_length.end();
	// iterate through all alignments
	for (; it!=end; ++it) {
		const AlignmentRecord* alignment2 = alignments[it->second];

        //if(alignment->getName().find("normal14") != string::npos && alignment2->getName().find("normal14") != string::npos){
        //       int k = 0;
        //}
		// cerr << "  comparing to " << alignments[it->second]->getID() << ", length " << it->first << ", read group: " << alignments[it->second]->getReadGroup();
        bool set_edge = edge_calculator.edgeBetween(*alignment, *alignment2,numGCAllowedPos,ct);
        //if(a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos){
        //FOR DEBUGGING
        //}
        if (set_edge && (second_edge_calculator != nullptr)) {
            set_edge = second_edge_calculator->edgeBetween(*alignment,*alignment2,numGCAllowedPos,ct);
		}
		if (set_edge) {
            edgecounter++;
            //cout << "Edge: " << alignment->getName() << " and " << alignment2->getName() << endl;
			adjacent.set(it->second, true);
			// cerr << " --> EDGE";
			if (lw != nullptr) {
                lw->reportEdge(alignment->getID(), alignment2->getID());
            }
            converged = false;
        }else{
            nonEdgeCounter++;
        }
		// cerr << endl;
	}

    alignments_by_length.insert(make_pair(0, index));

	// iterate over all active cliques. output those that lie left of current segment and
	// check intersection with current node for the rest
	clique_list_t::iterator clique_it = cliques->begin();
	// cliques that contain the newly added alignment and
	// therefore need to be checked for subset relations,
	// i.e. if one of these cliques is contained in another,
	// it must be discarded as it is not maximal.
	vector<Clique*> new_cliques;
	while (clique_it!=cliques->end()) {
		Clique* clique = *clique_it;
		if (clique->rightmostSegmentEnd() < alignment->getIntervalStart()) {
			clique_it = cliques->erase(clique_it);
            clique_collector.add(unique_ptr<Clique>(clique),this->appearanceMap);
		} else {
			// is there an intersection between nodes adjacent to the new
			// alignment and the currently considered clique?
			unique_ptr<alignment_set_t> intersection = clique->intersect(adjacent);
			if (intersection->any()) {
				// is node adjacent to all nodes in the clique?
				if (intersection->count() == clique->size()) {
					// cout << "   Adding to clique " << (*clique) << endl;
					clique->add(index);
					new_cliques.push_back(clique);
					clique_it = cliques->erase(clique_it);
				} else {
					Clique* split_off_clique = new Clique(*this, intersection);
					split_off_clique->add(index);
					// cout << "   Splitting off clique " << (*clique) << " --> " << (*split_off_clique) << endl;
					new_cliques.push_back(split_off_clique);
					++clique_it;
				}
			} else {
				// cout << "   Empty intersection for clique " << (*clique) << endl;
				++clique_it;
			}
		}
	}
	// if current alignment has not been assigned to at least one
	// of the existing cliques, let it form its own singleton clique
	if (new_cliques.size() == 0) {
		new_cliques.push_back(new Clique(*this, index, capacity));
	}

	// check for subset relations and delete cliques that are subsets of others
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]==0) continue;
		Clique* clique_i = new_cliques[i];
		for (size_t j=i+1; j<new_cliques.size(); ++j) {
			if (new_cliques[j]==0) continue;
			Clique* clique_j = new_cliques[j];
			if (clique_i->size()<=clique_j->size()) {
				if (clique_j->contains(*clique_i)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_i;
					new_cliques[i] = nullptr;
					break;
				}
			} else {
				if (clique_i->contains(*clique_j)) {
					// cout << "Removing duplicate or non-maximal clique!" << endl;
					delete clique_j;
					new_cliques[j] = nullptr;
					continue;
				}
			}
		}
	}
	//double cpu_time = (double) (clock() - clock_start) / CLOCKS_PER_SEC;
	//int clique_size_new = 0;
	for (size_t i=0; i<new_cliques.size(); ++i) {
		if (new_cliques[i]!=nullptr) {
			cliques->push_back(new_cliques[i]);
			//clique_size_new++;
		}
	}

	//cout << cliques->size() << "\t" << alignment_count << "\t" << clique_size_old << "\t" << clique_size_new << "\t" << cpu_time << "\t" << no_sort << endl;
    /*cout << "  Current Alignments: ";
	for (size_t i=0; i<alignment_count; ++i) {
		cout << alignments[i]->getID() << " ";
	}
	cout << endl;
	cout << "  Current cliques:"<<  endl;
	for (clique_it = cliques->begin();clique_it!=cliques->end(); ++clique_it) {
		cout << "    " << **clique_it << endl;
    }*/

}